

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockSymbols.cpp
# Opt level: O0

StatementBlockSymbol *
slang::ast::StatementBlockSymbol::fromSyntax(Scope *scope,RsRuleSyntax *syntax)

{
  bool bVar1;
  Compilation *args_3;
  StatementBlockSymbol *this;
  reference ppRVar2;
  SyntaxNode *in_RSI;
  Scope *in_RDI;
  Token TVar3;
  RsProdSyntax *prod;
  iterator __end2;
  iterator __begin2;
  SyntaxList<slang::syntax::RsProdSyntax> *__range2;
  StatementBlockSymbol *result;
  Compilation *comp;
  SyntaxNode *in_stack_000005b8;
  Scope *in_stack_000005c0;
  Symbol *in_stack_ffffffffffffff58;
  Scope *in_stack_ffffffffffffff60;
  span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL> *in_stack_ffffffffffffff68;
  VariableLifetime *in_stack_ffffffffffffff78;
  Compilation *args_2;
  SyntaxNode *in_stack_ffffffffffffff90;
  SyntaxNode *this_00;
  Compilation *in_stack_ffffffffffffff98;
  __normal_iterator<slang::syntax::RsProdSyntax_**,_std::span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL>_>
  in_stack_ffffffffffffffa0;
  
  args_3 = Scope::getCompilation(in_RDI);
  args_2 = args_3;
  sv((char *)in_stack_ffffffffffffff60,(size_t)in_stack_ffffffffffffff58);
  TVar3 = slang::syntax::SyntaxNode::getFirstToken(in_stack_ffffffffffffff90);
  parsing::Token::location((Token *)&stack0xffffffffffffffb8);
  this = BumpAllocator::
         emplace<slang::ast::StatementBlockSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::StatementBlockKind,slang::ast::VariableLifetime>
                   ((BumpAllocator *)in_stack_ffffffffffffffa0._M_current,in_stack_ffffffffffffff98,
                    (basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff90,
                    (SourceLocation *)args_2,(StatementBlockKind *)args_3,in_stack_ffffffffffffff78)
  ;
  Symbol::setSyntax(&this->super_Symbol,in_RSI);
  Scope::setNeedElaboration((Scope *)0x5c006a);
  std::span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL>::begin
            ((span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL> *)
             in_stack_ffffffffffffff58);
  std::span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL>::end(in_stack_ffffffffffffff68);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<slang::syntax::RsProdSyntax_**,_std::span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL>_>
                      ((__normal_iterator<slang::syntax::RsProdSyntax_**,_std::span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffff60,
                       (__normal_iterator<slang::syntax::RsProdSyntax_**,_std::span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffff58);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppRVar2 = __gnu_cxx::
              __normal_iterator<slang::syntax::RsProdSyntax_**,_std::span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL>_>
              ::operator*((__normal_iterator<slang::syntax::RsProdSyntax_**,_std::span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL>_>
                           *)&stack0xffffffffffffffa0);
    this_00 = &(*ppRVar2)->super_SyntaxNode;
    if (this_00->previewNode != (SyntaxNode *)0x0) {
      Scope::addMembers(in_stack_000005c0,in_stack_000005b8);
    }
    if (this_00->kind == RsCodeBlock) {
      slang::syntax::SyntaxNode::as<slang::syntax::RsCodeBlockSyntax>(this_00);
      fromSyntax((Scope *)TVar3.info,TVar3._0_8_);
      Scope::addMember(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    }
    if ((in_RSI[3].previewNode != (SyntaxNode *)0x0) && (*(long *)(in_RSI[3].previewNode + 2) != 0))
    {
      in_stack_ffffffffffffff60 = in_RDI;
      slang::syntax::SyntaxNode::as<slang::syntax::RsCodeBlockSyntax>
                (*(SyntaxNode **)(in_RSI[3].previewNode + 2));
      fromSyntax((Scope *)TVar3.info,TVar3._0_8_);
      Scope::addMember(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    }
    __gnu_cxx::
    __normal_iterator<slang::syntax::RsProdSyntax_**,_std::span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL>_>
    ::operator++((__normal_iterator<slang::syntax::RsProdSyntax_**,_std::span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL>_>
                  *)&stack0xffffffffffffffa0);
  }
  return this;
}

Assistant:

StatementBlockSymbol& StatementBlockSymbol::fromSyntax(const Scope& scope,
                                                       const RsRuleSyntax& syntax) {
    auto& comp = scope.getCompilation();
    auto result = comp.emplace<StatementBlockSymbol>(comp, ""sv, syntax.getFirstToken().location(),
                                                     StatementBlockKind::Sequential,
                                                     VariableLifetime::Automatic);
    result->setSyntax(syntax);
    result->setNeedElaboration();

    for (auto prod : syntax.prods) {
        if (prod->previewNode)
            result->addMembers(*prod->previewNode);

        if (prod->kind == SyntaxKind::RsCodeBlock) {
            result->addMember(
                StatementBlockSymbol::fromSyntax(scope, prod->as<RsCodeBlockSyntax>()));
        }

        if (syntax.weightClause && syntax.weightClause->codeBlock) {
            result->addMember(StatementBlockSymbol::fromSyntax(
                scope, syntax.weightClause->codeBlock->as<RsCodeBlockSyntax>()));
        }
    }

    return *result;
}